

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

void pzshape::TPZShapeTetra::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  long row;
  int xj;
  long lVar22;
  double dVar23;
  
  lVar21 = 4;
  do {
    if (lVar21 == 0xf) {
      for (lVar21 = 4; lVar21 != 0xf; lVar21 = lVar21 + 1) {
        dVar23 = *(double *)(&DAT_0130a500 + lVar21 * 8);
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar21,0);
        *pdVar19 = *pdVar19 * dVar23;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,0,lVar21);
        *pdVar19 = *pdVar19 * dVar23;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,1,lVar21);
        *pdVar19 = *pdVar19 * dVar23;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,2,lVar21);
        *pdVar19 = dVar23 * *pdVar19;
      }
      return;
    }
    iVar17 = (int)lVar21;
    iVar16 = pztopology::TPZTetrahedron::NSideNodes(iVar17);
    if (iVar16 == 4) {
      pdVar19 = TPZFMatrix<double>::operator()(phi,0,0);
      dVar23 = *pdVar19;
      pdVar19 = TPZFMatrix<double>::operator()(phi,1,0);
      dVar1 = *pdVar19;
      pdVar19 = TPZFMatrix<double>::operator()(phi,2,0);
      dVar2 = *pdVar19;
      pdVar19 = TPZFMatrix<double>::operator()(phi,3,0);
      dVar3 = *pdVar19;
      pdVar19 = TPZFMatrix<double>::operator()(phi,lVar21,0);
      *pdVar19 = dVar23 * dVar1 * dVar2 * dVar3;
      for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
        pdVar19 = TPZFMatrix<double>::operator()(dphi,lVar20,0);
        dVar23 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,1,0);
        dVar1 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar2 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,3,0);
        dVar3 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar4 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,lVar20,1);
        dVar5 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar6 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,3,0);
        dVar7 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar8 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,1,0);
        dVar9 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,lVar20,2);
        dVar10 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,3,0);
        dVar11 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,0,0);
        dVar12 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,1,0);
        dVar13 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,2,0);
        dVar14 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,lVar20,3);
        dVar15 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,lVar20,lVar21);
        *pdVar19 = dVar12 * dVar13 * dVar14 * dVar15 +
                   dVar8 * dVar9 * dVar10 * dVar11 +
                   dVar4 * dVar5 * dVar6 * dVar7 + dVar23 * dVar1 * dVar2 * dVar3;
      }
    }
    else {
      if (iVar16 == 3) {
        iVar16 = pztopology::TPZTetrahedron::SideNodeLocId(iVar17,0);
        iVar18 = pztopology::TPZTetrahedron::SideNodeLocId(iVar17,1);
        iVar17 = pztopology::TPZTetrahedron::SideNodeLocId(iVar17,2);
        row = (long)iVar16;
        pdVar19 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar23 = *pdVar19;
        lVar20 = (long)iVar18;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar1 = *pdVar19;
        lVar22 = (long)iVar17;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar2 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar21,0);
        *pdVar19 = dVar23 * dVar1 * dVar2;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,0,row);
        dVar23 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar1 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar2 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar3 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,0,lVar20);
        dVar4 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar5 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar6 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar7 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,0,lVar22);
        dVar8 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,0,lVar21);
        *pdVar19 = dVar6 * dVar7 * dVar8 + dVar3 * dVar4 * dVar5 + dVar23 * dVar1 * dVar2;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,1,row);
        dVar23 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar1 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar2 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar3 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,1,lVar20);
        dVar4 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar5 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar6 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar7 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,1,lVar22);
        dVar8 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,1,lVar21);
        *pdVar19 = dVar6 * dVar7 * dVar8 + dVar3 * dVar4 * dVar5 + dVar23 * dVar1 * dVar2;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,2,row);
        dVar23 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar1 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar2 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar3 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,2,lVar20);
        dVar4 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar5 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,row,0);
        dVar6 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar7 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,2,lVar22);
        dVar23 = dVar6 * dVar7 * *pdVar19 + dVar3 * dVar4 * dVar5 + dVar23 * dVar1 * dVar2;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,2,lVar21);
      }
      else {
        if (iVar16 != 2) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                     ,0x91);
        }
        iVar16 = pztopology::TPZTetrahedron::SideNodeLocId(iVar17,0);
        iVar17 = pztopology::TPZTetrahedron::SideNodeLocId(iVar17,1);
        lVar20 = (long)iVar16;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar23 = *pdVar19;
        lVar22 = (long)iVar17;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar1 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar21,0);
        *pdVar19 = dVar23 * dVar1;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,0,lVar20);
        dVar23 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar1 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar2 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,0,lVar22);
        dVar3 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,0,lVar21);
        *pdVar19 = dVar2 * dVar3 + dVar23 * dVar1;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,1,lVar20);
        dVar23 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar1 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar2 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,1,lVar22);
        dVar3 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,1,lVar21);
        *pdVar19 = dVar2 * dVar3 + dVar23 * dVar1;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,2,lVar20);
        dVar23 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar22,0);
        dVar1 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(phi,lVar20,0);
        dVar2 = *pdVar19;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,2,lVar22);
        dVar23 = dVar2 * *pdVar19 + dVar23 * dVar1;
        pdVar19 = TPZFMatrix<double>::operator()(dphi,2,lVar21);
      }
      *pdVar19 = dVar23;
    }
    lVar21 = lVar21 + 1;
  } while( true );
}

Assistant:

void TPZShapeTetra::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		// 6 ribs
		for(is=4; is<NSides; is++)
		{
			int nsnodes = NSideNodes(is);
			switch(nsnodes)
			{
				case 2:
				{
					int is1 = SideNodeLocId(is,0);
					int is2 = SideNodeLocId(is,1);
					phi(is,0) = phi(is1,0)*phi(is2,0);
					dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
					dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
					dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
				}
					break;
				case 3:
				{
					//int face = is-10;
					int is1 = SideNodeLocId(is,0); //ShapeFaceId[face][0]; 
					int is2 = SideNodeLocId(is,1); //ShapeFaceId[face][1]; 
					int is3 = SideNodeLocId(is,2); //ShapeFaceId[face][2]; 
					phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
					dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
					dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
					dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
				}
					break;
				case 4:
				{
					phi(is,0) = phi(0,0)*phi(1,0)*phi(2,0)*phi(3,0);
					for(int xj=0;xj<3;xj++) {
						dphi(xj,is) = dphi(xj,0)* phi(1 ,0)* phi(2 ,0)* phi(3 ,0) +
						phi(0, 0)*dphi(xj,1)* phi(2 ,0)* phi(3 ,0) +
						phi(0, 0)* phi(1 ,0)*dphi(xj,2)* phi(3 ,0) +
						phi(0, 0)* phi(1 ,0)* phi(2 ,0)*dphi(xj,3);
					}
				}
					break;
					
				default:
					DebugStop();
			}
		}

		REAL mult[] = {1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,27.,27.,27.,27.,54.};
		for(is=4;is<NSides; is++)
		{
			phi(is,0) *= mult[is];
			dphi(0,is) *= mult[is];
			dphi(1,is) *= mult[is];
			dphi(2,is) *= mult[is];
		}
		 
	}